

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O2

void __thiscall Hpipe::InstructionClrStr::get_code_repr(InstructionClrStr *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"CLR_STR ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionClrStr::get_code_repr( std::ostream &os ) {
    os << "CLR_STR " << var.size() << " " << var;
}